

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O1

OptionStatus
setLocalOptionValue(HighsLogOptions *report_log_options,OptionRecordString *option,string *value)

{
  pointer pcVar1;
  OptionStatus OVar2;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  pcVar1 = (value->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + value->_M_string_length);
  OVar2 = checkOptionValue(report_log_options,option,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (OVar2 == kOk) {
    pcVar1 = (value->_M_dataplus)._M_p;
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,pcVar1,pcVar1 + value->_M_string_length);
    std::__cxx11::string::_M_assign((string *)option->value);
    OVar2 = kOk;
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
  }
  return OVar2;
}

Assistant:

OptionStatus setLocalOptionValue(const HighsLogOptions& report_log_options,
                                 OptionRecordString& option,
                                 const std::string value) {
  OptionStatus return_status =
      checkOptionValue(report_log_options, option, value);
  if (return_status != OptionStatus::kOk) return return_status;
  option.assignvalue(value);
  return OptionStatus::kOk;
}